

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O3

size_t __thiscall
clog::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
size(BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this)

{
  _Map_pointer ppbVar1;
  _Map_pointer ppbVar2;
  _Elt_pointer pbVar3;
  _Elt_pointer pbVar4;
  _Elt_pointer pbVar5;
  _Elt_pointer pbVar6;
  int iVar7;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar7 == 0) {
    ppbVar1 = (this->_queue).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppbVar2 = (this->_queue).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pbVar3 = (this->_queue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pbVar4 = (this->_queue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pbVar5 = (this->_queue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pbVar6 = (this->_queue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return ((long)pbVar3 - (long)pbVar6 >> 5) + ((long)pbVar4 - (long)pbVar5 >> 5) +
           ((((ulong)((long)ppbVar1 - (long)ppbVar2) >> 3) - 1) +
           (ulong)(ppbVar1 == (_Map_pointer)0x0)) * 0x10;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

size_t size() const 
    {
        MutexLockGuard lock(_mutex);
        return _queue.size();
    }